

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
gl4cts::EnhancedLayouts::Utils::Type::GenerateDataPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Type *this)

{
  GLuint GVar1;
  uint uVar2;
  GLint GVar3;
  reference pvVar4;
  GLfloat GVar5;
  GLdouble GVar6;
  uint local_7c;
  GLuint i_3;
  GLuint *ui_ptr;
  GLuint i_2;
  GLint *i_ptr;
  GLuint i_1;
  GLfloat *f_ptr;
  GLuint i;
  GLdouble *d_ptr;
  GLvoid *ptr;
  GLuint size;
  GLuint n_elements;
  GLuint basic_size;
  Type *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  
  GVar1 = GetTypeSize(this->m_basic_type);
  uVar2 = this->m_n_columns * this->m_n_rows;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,(ulong)(GVar1 * uVar2));
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,0);
  switch(this->m_basic_type) {
  case Float:
    for (i_ptr._4_4_ = 0; i_ptr._4_4_ < uVar2; i_ptr._4_4_ = i_ptr._4_4_ + 1) {
      GVar5 = GetRandFloat();
      *(GLfloat *)(pvVar4 + (ulong)i_ptr._4_4_ * 4) = GVar5;
    }
    break;
  case Double:
    for (f_ptr._4_4_ = 0; f_ptr._4_4_ < uVar2; f_ptr._4_4_ = f_ptr._4_4_ + 1) {
      GVar6 = GetRandDouble();
      *(GLdouble *)(pvVar4 + (ulong)f_ptr._4_4_ * 8) = GVar6;
    }
    break;
  case Int:
    for (ui_ptr._4_4_ = 0; ui_ptr._4_4_ < uVar2; ui_ptr._4_4_ = ui_ptr._4_4_ + 1) {
      GVar3 = GetRandInt();
      *(GLint *)(pvVar4 + (ulong)ui_ptr._4_4_ * 4) = GVar3;
    }
    break;
  case Uint:
    for (local_7c = 0; local_7c < uVar2; local_7c = local_7c + 1) {
      GVar1 = GetRandUint();
      *(GLuint *)(pvVar4 + (ulong)local_7c * 4) = GVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<GLubyte> Type::GenerateDataPacked() const
{
	const GLuint basic_size = GetTypeSize(m_basic_type);
	const GLuint n_elements = m_n_columns * m_n_rows;
	const GLuint size		= basic_size * n_elements;

	std::vector<GLubyte> data;
	data.resize(size);

	GLvoid* ptr = (GLvoid*)&data[0];

	switch (m_basic_type)
	{
	case Double:
	{
		GLdouble* d_ptr = (GLdouble*)ptr;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			d_ptr[i] = GetRandDouble();
		}
	}
	break;
	case Float:
	{
		GLfloat* f_ptr = (GLfloat*)ptr;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			f_ptr[i] = GetRandFloat();
		}
	}
	break;
	case Int:
	{
		GLint* i_ptr = (GLint*)ptr;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			i_ptr[i] = GetRandInt();
		}
	}
	break;
	case Uint:
	{
		GLuint* ui_ptr = (GLuint*)ptr;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			ui_ptr[i] = GetRandUint();
		}
	}
	break;
	}

	return data;
}